

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_pred.hpp
# Opt level: O1

AssertionResult * __thiscall
iutest::AssertPred1Helper<bool(*)(int),int>
          (AssertionResult *__return_storage_ptr__,iutest *this,char *pred_str,char *expr1,
          _func_bool_int *pred,int val1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char cVar3;
  AssertionResult *pAVar4;
  int local_54;
  char *local_50;
  iutest *local_48;
  AssertionResult local_40;
  
  local_54 = (int)pred;
  local_50 = pred_str;
  local_48 = this;
  cVar3 = (*(code *)expr1)((ulong)pred & 0xffffffff);
  if (cVar3 == '\0') {
    paVar1 = &local_40.m_message.field_2;
    local_40.m_message._M_string_length = 0;
    local_40.m_message.field_2._M_local_buf[0] = '\0';
    local_40.m_result = false;
    local_40.m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar4 = AssertionResult::operator<<(&local_40,(char (*) [8])"error: ");
    pAVar4 = AssertionResult::operator<<(pAVar4,(char **)&local_48);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [2])0x338907);
    pAVar4 = AssertionResult::operator<<(pAVar4,&local_50);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [29])") evaluates to false, where ");
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [2])0x32eeda);
    pAVar4 = AssertionResult::operator<<(pAVar4,&local_50);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [4])0x32fbde);
    pAVar4 = AssertionResult::operator<<(pAVar4,&local_54);
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar2 = (pAVar4->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar4->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar4->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_40.m_message._M_dataplus._M_p,
                      CONCAT71(local_40.m_message.field_2._M_allocated_capacity._1_7_,
                               local_40.m_message.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionResult AssertPred1Helper(const char* pred_str, const char* expr1
    , PRED pred, T1 val1)
{
    if IUTEST_COND_LIKELY( (*pred)(val1) )
    {
        return AssertionSuccess();
    }
    return AssertionFailure() << "error: " << pred_str << "(" << expr1 << ") evaluates to false, where "
        << "\n" << expr1 << " : " << val1;
}